

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O1

QCborMap __thiscall QCborMap::fromVariantMap(QCborMap *this,QVariantMap *map)

{
  QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
  *pQVar1;
  QCborContainerPrivate *this_00;
  _Base_ptr p_Var2;
  size_t reserved;
  _Base_ptr p_Var3;
  QStringView s;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborMap(this);
  pQVar1 = (map->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    reserved = 0;
  }
  else {
    reserved = (pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  }
  detach(this,reserved);
  pQVar1 = (map->d).d.ptr;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = *(_Base_ptr *)((long)&(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  }
  p_Var3 = &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pQVar1 == (QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>
                 *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  if (p_Var2 != p_Var3) {
    this_00 = (this->d).d.ptr;
    do {
      s.m_data = (storage_type_conflict *)p_Var2[1]._M_parent;
      s.m_size = (qsizetype)p_Var2[1]._M_left;
      QCborContainerPrivate::append(this_00,s);
      appendVariant(this_00,(QVariant *)&p_Var2[1]._M_right);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while (p_Var2 != p_Var3);
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborMap QCborMap::fromVariantMap(const QVariantMap &map)
{
    QCborMap m;
    m.detach(map.size());
    QCborContainerPrivate *d = m.d.data();

    auto it = map.begin();
    auto end = map.end();
    for ( ; it != end; ++it) {
        d->append(it.key());
        appendVariant(d, it.value());
    }
    return m;
}